

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O0

int run_test_thread_rwlock(void)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_48 [4];
  int r;
  uv_rwlock_t rwlock;
  
  iVar1 = uv_rwlock_init(local_48);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x4e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_rwlock_rdlock(local_48);
  uv_rwlock_rdunlock(local_48);
  uv_rwlock_wrlock(local_48);
  uv_rwlock_wrunlock(local_48);
  uv_rwlock_destroy(local_48);
  return 0;
}

Assistant:

TEST_IMPL(thread_rwlock) {
  uv_rwlock_t rwlock;
  int r;

  r = uv_rwlock_init(&rwlock);
  ASSERT_OK(r);

  uv_rwlock_rdlock(&rwlock);
  uv_rwlock_rdunlock(&rwlock);
  uv_rwlock_wrlock(&rwlock);
  uv_rwlock_wrunlock(&rwlock);
  uv_rwlock_destroy(&rwlock);

  return 0;
}